

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_util_lite.cc
# Opt level: O1

void google::protobuf::TestUtilLite::ExpectPackedExtensionsSet(TestPackedExtensionsLite *message)

{
  internal iVar1;
  bool bVar2;
  anon_union_32_1_493b367e_for_TestPackedExtensionsLite_3 *this;
  char *pcVar3;
  char *in_R9;
  pointer *__ptr;
  AssertionResult gtest_ar_;
  AssertionResult gtest_ar;
  AssertHelper local_70;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_60;
  undefined1 local_58 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_50;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_48;
  AssertHelper local_38;
  
  local_68._M_head_impl._0_4_ = 2;
  this = &message->field_0;
  local_70.data_._0_4_ =
       (float)protobuf::internal::ExtensionSet::ExtensionSize
                        (&(this->_impl_)._extensions_,proto2_unittest::packed_int32_extension_lite);
  testing::internal::CmpHelperEQ<int,int>
            ((internal *)local_58,"2","message.ExtensionSize(unittest::packed_int32_extension_lite)"
             ,(int *)&local_68,(int *)&local_70);
  iVar1 = local_58[0];
  if (local_58[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_68);
    if (local_50 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar3 = anon_var_dwarf_a12c75 + 5;
    }
    else {
      pcVar3 = (local_50->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_70,kFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util_lite.cc"
               ,0x703,pcVar3);
    testing::internal::AssertHelper::operator=(&local_70,(Message *)&local_68);
    testing::internal::AssertHelper::~AssertHelper(&local_70);
    if (local_68._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_68._M_head_impl + 8))();
    }
  }
  if (local_50 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_50,local_50);
  }
  if (iVar1 != (internal)0x0) {
    local_68._M_head_impl._0_4_ = 2;
    local_70.data_._0_4_ =
         (float)protobuf::internal::ExtensionSet::ExtensionSize
                          (&(this->_impl_)._extensions_,proto2_unittest::packed_int64_extension_lite
                          );
    testing::internal::CmpHelperEQ<int,int>
              ((internal *)local_58,"2",
               "message.ExtensionSize(unittest::packed_int64_extension_lite)",(int *)&local_68,
               (int *)&local_70);
    iVar1 = local_58[0];
    if (local_58[0] == (internal)0x0) {
      testing::Message::Message((Message *)&local_68);
      if (local_50 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar3 = anon_var_dwarf_a12c75 + 5;
      }
      else {
        pcVar3 = (local_50->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_70,kFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util_lite.cc"
                 ,0x704,pcVar3);
      testing::internal::AssertHelper::operator=(&local_70,(Message *)&local_68);
      testing::internal::AssertHelper::~AssertHelper(&local_70);
      if (local_68._M_head_impl !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        (**(code **)(*(long *)local_68._M_head_impl + 8))();
      }
    }
    if (local_50 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_50,local_50);
    }
    if (iVar1 != (internal)0x0) {
      local_68._M_head_impl._0_4_ = 2;
      local_70.data_._0_4_ =
           (float)protobuf::internal::ExtensionSet::ExtensionSize
                            (&(this->_impl_)._extensions_,
                             proto2_unittest::packed_uint32_extension_lite);
      testing::internal::CmpHelperEQ<int,int>
                ((internal *)local_58,"2",
                 "message.ExtensionSize(unittest::packed_uint32_extension_lite)",(int *)&local_68,
                 (int *)&local_70);
      iVar1 = local_58[0];
      if (local_58[0] == (internal)0x0) {
        testing::Message::Message((Message *)&local_68);
        if (local_50 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          pcVar3 = anon_var_dwarf_a12c75 + 5;
        }
        else {
          pcVar3 = (local_50->_M_dataplus)._M_p;
        }
        testing::internal::AssertHelper::AssertHelper
                  (&local_70,kFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util_lite.cc"
                   ,0x705,pcVar3);
        testing::internal::AssertHelper::operator=(&local_70,(Message *)&local_68);
        testing::internal::AssertHelper::~AssertHelper(&local_70);
        if (local_68._M_head_impl !=
            (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          (**(code **)(*(long *)local_68._M_head_impl + 8))();
        }
      }
      if (local_50 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        std::
        default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&local_50,local_50);
      }
      if (iVar1 != (internal)0x0) {
        local_68._M_head_impl._0_4_ = 2;
        local_70.data_._0_4_ =
             (float)protobuf::internal::ExtensionSet::ExtensionSize
                              (&(this->_impl_)._extensions_,
                               proto2_unittest::packed_uint64_extension_lite);
        testing::internal::CmpHelperEQ<int,int>
                  ((internal *)local_58,"2",
                   "message.ExtensionSize(unittest::packed_uint64_extension_lite)",(int *)&local_68,
                   (int *)&local_70);
        iVar1 = local_58[0];
        if (local_58[0] == (internal)0x0) {
          testing::Message::Message((Message *)&local_68);
          if (local_50 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
          {
            pcVar3 = anon_var_dwarf_a12c75 + 5;
          }
          else {
            pcVar3 = (local_50->_M_dataplus)._M_p;
          }
          testing::internal::AssertHelper::AssertHelper
                    (&local_70,kFatalFailure,
                     "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util_lite.cc"
                     ,0x706,pcVar3);
          testing::internal::AssertHelper::operator=(&local_70,(Message *)&local_68);
          testing::internal::AssertHelper::~AssertHelper(&local_70);
          if (local_68._M_head_impl !=
              (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
            (**(code **)(*(long *)local_68._M_head_impl + 8))();
          }
        }
        if (local_50 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          std::
          default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)&local_50,local_50);
        }
        if (iVar1 != (internal)0x0) {
          local_68._M_head_impl._0_4_ = 2;
          local_70.data_._0_4_ =
               (float)protobuf::internal::ExtensionSet::ExtensionSize
                                (&(this->_impl_)._extensions_,
                                 proto2_unittest::packed_sint32_extension_lite);
          testing::internal::CmpHelperEQ<int,int>
                    ((internal *)local_58,"2",
                     "message.ExtensionSize(unittest::packed_sint32_extension_lite)",
                     (int *)&local_68,(int *)&local_70);
          iVar1 = local_58[0];
          if (local_58[0] == (internal)0x0) {
            testing::Message::Message((Message *)&local_68);
            if (local_50 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
               ) {
              pcVar3 = anon_var_dwarf_a12c75 + 5;
            }
            else {
              pcVar3 = (local_50->_M_dataplus)._M_p;
            }
            testing::internal::AssertHelper::AssertHelper
                      (&local_70,kFatalFailure,
                       "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util_lite.cc"
                       ,0x707,pcVar3);
            testing::internal::AssertHelper::operator=(&local_70,(Message *)&local_68);
            testing::internal::AssertHelper::~AssertHelper(&local_70);
            if (local_68._M_head_impl !=
                (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
              (**(code **)(*(long *)local_68._M_head_impl + 8))();
            }
          }
          if (local_50 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
          {
            std::
            default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          *)&local_50,local_50);
          }
          if (iVar1 != (internal)0x0) {
            local_68._M_head_impl._0_4_ = 2;
            local_70.data_._0_4_ =
                 (float)protobuf::internal::ExtensionSet::ExtensionSize
                                  (&(this->_impl_)._extensions_,
                                   proto2_unittest::packed_sint64_extension_lite);
            testing::internal::CmpHelperEQ<int,int>
                      ((internal *)local_58,"2",
                       "message.ExtensionSize(unittest::packed_sint64_extension_lite)",
                       (int *)&local_68,(int *)&local_70);
            iVar1 = local_58[0];
            if (local_58[0] == (internal)0x0) {
              testing::Message::Message((Message *)&local_68);
              if (local_50 ==
                  (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
                pcVar3 = anon_var_dwarf_a12c75 + 5;
              }
              else {
                pcVar3 = (local_50->_M_dataplus)._M_p;
              }
              testing::internal::AssertHelper::AssertHelper
                        (&local_70,kFatalFailure,
                         "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util_lite.cc"
                         ,0x708,pcVar3);
              testing::internal::AssertHelper::operator=(&local_70,(Message *)&local_68);
              testing::internal::AssertHelper::~AssertHelper(&local_70);
              if (local_68._M_head_impl !=
                  (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
                (**(code **)(*(long *)local_68._M_head_impl + 8))();
              }
            }
            if (local_50 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
               ) {
              std::
              default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                            *)&local_50,local_50);
            }
            if (iVar1 != (internal)0x0) {
              local_68._M_head_impl._0_4_ = 2;
              local_70.data_._0_4_ =
                   (float)protobuf::internal::ExtensionSet::ExtensionSize
                                    (&(this->_impl_)._extensions_,
                                     proto2_unittest::packed_fixed32_extension_lite);
              testing::internal::CmpHelperEQ<int,int>
                        ((internal *)local_58,"2",
                         "message.ExtensionSize(unittest::packed_fixed32_extension_lite)",
                         (int *)&local_68,(int *)&local_70);
              iVar1 = local_58[0];
              if (local_58[0] == (internal)0x0) {
                testing::Message::Message((Message *)&local_68);
                if (local_50 ==
                    (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
                  pcVar3 = anon_var_dwarf_a12c75 + 5;
                }
                else {
                  pcVar3 = (local_50->_M_dataplus)._M_p;
                }
                testing::internal::AssertHelper::AssertHelper
                          (&local_70,kFatalFailure,
                           "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util_lite.cc"
                           ,0x709,pcVar3);
                testing::internal::AssertHelper::operator=(&local_70,(Message *)&local_68);
                testing::internal::AssertHelper::~AssertHelper(&local_70);
                if (local_68._M_head_impl !=
                    (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
                {
                  (**(code **)(*(long *)local_68._M_head_impl + 8))();
                }
              }
              if (local_50 !=
                  (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
                std::
                default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                              *)&local_50,local_50);
              }
              if (iVar1 != (internal)0x0) {
                local_68._M_head_impl._0_4_ = 2;
                local_70.data_._0_4_ =
                     (float)protobuf::internal::ExtensionSet::ExtensionSize
                                      (&(this->_impl_)._extensions_,
                                       proto2_unittest::packed_fixed64_extension_lite);
                testing::internal::CmpHelperEQ<int,int>
                          ((internal *)local_58,"2",
                           "message.ExtensionSize(unittest::packed_fixed64_extension_lite)",
                           (int *)&local_68,(int *)&local_70);
                iVar1 = local_58[0];
                if (local_58[0] == (internal)0x0) {
                  testing::Message::Message((Message *)&local_68);
                  if (local_50 ==
                      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
                    pcVar3 = anon_var_dwarf_a12c75 + 5;
                  }
                  else {
                    pcVar3 = (local_50->_M_dataplus)._M_p;
                  }
                  testing::internal::AssertHelper::AssertHelper
                            (&local_70,kFatalFailure,
                             "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util_lite.cc"
                             ,0x70a,pcVar3);
                  testing::internal::AssertHelper::operator=(&local_70,(Message *)&local_68);
                  testing::internal::AssertHelper::~AssertHelper(&local_70);
                  if (local_68._M_head_impl !=
                      (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
                     ) {
                    (**(code **)(*(long *)local_68._M_head_impl + 8))();
                  }
                }
                if (local_50 !=
                    (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
                  std::
                  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                *)&local_50,local_50);
                }
                if (iVar1 != (internal)0x0) {
                  local_68._M_head_impl._0_4_ = 2;
                  local_70.data_._0_4_ =
                       (float)protobuf::internal::ExtensionSet::ExtensionSize
                                        (&(this->_impl_)._extensions_,
                                         proto2_unittest::packed_sfixed32_extension_lite);
                  testing::internal::CmpHelperEQ<int,int>
                            ((internal *)local_58,"2",
                             "message.ExtensionSize(unittest::packed_sfixed32_extension_lite)",
                             (int *)&local_68,(int *)&local_70);
                  iVar1 = local_58[0];
                  if (local_58[0] == (internal)0x0) {
                    testing::Message::Message((Message *)&local_68);
                    if (local_50 ==
                        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
                      pcVar3 = anon_var_dwarf_a12c75 + 5;
                    }
                    else {
                      pcVar3 = (local_50->_M_dataplus)._M_p;
                    }
                    testing::internal::AssertHelper::AssertHelper
                              (&local_70,kFatalFailure,
                               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util_lite.cc"
                               ,0x70b,pcVar3);
                    testing::internal::AssertHelper::operator=(&local_70,(Message *)&local_68);
                    testing::internal::AssertHelper::~AssertHelper(&local_70);
                    if (local_68._M_head_impl !=
                        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        0x0) {
                      (**(code **)(*(long *)local_68._M_head_impl + 8))();
                    }
                  }
                  if (local_50 !=
                      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
                    std::
                    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                  *)&local_50,local_50);
                  }
                  if (iVar1 != (internal)0x0) {
                    local_68._M_head_impl._0_4_ = 2;
                    local_70.data_._0_4_ =
                         (float)protobuf::internal::ExtensionSet::ExtensionSize
                                          (&(this->_impl_)._extensions_,
                                           proto2_unittest::packed_sfixed64_extension_lite);
                    testing::internal::CmpHelperEQ<int,int>
                              ((internal *)local_58,"2",
                               "message.ExtensionSize(unittest::packed_sfixed64_extension_lite)",
                               (int *)&local_68,(int *)&local_70);
                    iVar1 = local_58[0];
                    if (local_58[0] == (internal)0x0) {
                      testing::Message::Message((Message *)&local_68);
                      if (local_50 ==
                          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
                      {
                        pcVar3 = anon_var_dwarf_a12c75 + 5;
                      }
                      else {
                        pcVar3 = (local_50->_M_dataplus)._M_p;
                      }
                      testing::internal::AssertHelper::AssertHelper
                                (&local_70,kFatalFailure,
                                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util_lite.cc"
                                 ,0x70c,pcVar3);
                      testing::internal::AssertHelper::operator=(&local_70,(Message *)&local_68);
                      testing::internal::AssertHelper::~AssertHelper(&local_70);
                      if (local_68._M_head_impl !=
                          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *
                          )0x0) {
                        (**(code **)(*(long *)local_68._M_head_impl + 8))();
                      }
                    }
                    if (local_50 !=
                        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
                      std::
                      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                    *)&local_50,local_50);
                    }
                    if (iVar1 != (internal)0x0) {
                      local_68._M_head_impl._0_4_ = 2;
                      local_70.data_._0_4_ =
                           (float)protobuf::internal::ExtensionSet::ExtensionSize
                                            (&(this->_impl_)._extensions_,
                                             proto2_unittest::packed_float_extension_lite);
                      testing::internal::CmpHelperEQ<int,int>
                                ((internal *)local_58,"2",
                                 "message.ExtensionSize(unittest::packed_float_extension_lite)",
                                 (int *)&local_68,(int *)&local_70);
                      iVar1 = local_58[0];
                      if (local_58[0] == (internal)0x0) {
                        testing::Message::Message((Message *)&local_68);
                        if (local_50 ==
                            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
                           ) {
                          pcVar3 = anon_var_dwarf_a12c75 + 5;
                        }
                        else {
                          pcVar3 = (local_50->_M_dataplus)._M_p;
                        }
                        testing::internal::AssertHelper::AssertHelper
                                  (&local_70,kFatalFailure,
                                   "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util_lite.cc"
                                   ,0x70d,pcVar3);
                        testing::internal::AssertHelper::operator=(&local_70,(Message *)&local_68);
                        testing::internal::AssertHelper::~AssertHelper(&local_70);
                        if (local_68._M_head_impl !=
                            (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>
                             *)0x0) {
                          (**(code **)(*(long *)local_68._M_head_impl + 8))();
                        }
                      }
                      if (local_50 !=
                          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
                      {
                        std::
                        default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                      *)&local_50,local_50);
                      }
                      if (iVar1 != (internal)0x0) {
                        local_68._M_head_impl._0_4_ = 2;
                        local_70.data_._0_4_ =
                             (float)protobuf::internal::ExtensionSet::ExtensionSize
                                              (&(this->_impl_)._extensions_,
                                               proto2_unittest::packed_double_extension_lite);
                        testing::internal::CmpHelperEQ<int,int>
                                  ((internal *)local_58,"2",
                                   "message.ExtensionSize(unittest::packed_double_extension_lite)",
                                   (int *)&local_68,(int *)&local_70);
                        iVar1 = local_58[0];
                        if (local_58[0] == (internal)0x0) {
                          testing::Message::Message((Message *)&local_68);
                          if (local_50 ==
                              (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              0x0) {
                            pcVar3 = anon_var_dwarf_a12c75 + 5;
                          }
                          else {
                            pcVar3 = (local_50->_M_dataplus)._M_p;
                          }
                          testing::internal::AssertHelper::AssertHelper
                                    (&local_70,kFatalFailure,
                                     "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util_lite.cc"
                                     ,0x70e,pcVar3);
                          testing::internal::AssertHelper::operator=(&local_70,(Message *)&local_68)
                          ;
                          testing::internal::AssertHelper::~AssertHelper(&local_70);
                          if (local_68._M_head_impl !=
                              (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>
                               *)0x0) {
                            (**(code **)(*(long *)local_68._M_head_impl + 8))();
                          }
                        }
                        if (local_50 !=
                            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
                           ) {
                          std::
                          default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                        *)&local_50,local_50);
                        }
                        if (iVar1 != (internal)0x0) {
                          local_68._M_head_impl._0_4_ = 2;
                          local_70.data_._0_4_ =
                               (float)protobuf::internal::ExtensionSet::ExtensionSize
                                                (&(this->_impl_)._extensions_,
                                                 proto2_unittest::packed_bool_extension_lite);
                          testing::internal::CmpHelperEQ<int,int>
                                    ((internal *)local_58,"2",
                                     "message.ExtensionSize(unittest::packed_bool_extension_lite)",
                                     (int *)&local_68,(int *)&local_70);
                          iVar1 = local_58[0];
                          if (local_58[0] == (internal)0x0) {
                            testing::Message::Message((Message *)&local_68);
                            if (local_50 ==
                                (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )0x0) {
                              pcVar3 = anon_var_dwarf_a12c75 + 5;
                            }
                            else {
                              pcVar3 = (local_50->_M_dataplus)._M_p;
                            }
                            testing::internal::AssertHelper::AssertHelper
                                      (&local_70,kFatalFailure,
                                       "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util_lite.cc"
                                       ,0x70f,pcVar3);
                            testing::internal::AssertHelper::operator=
                                      (&local_70,(Message *)&local_68);
                            testing::internal::AssertHelper::~AssertHelper(&local_70);
                            if (local_68._M_head_impl !=
                                (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>
                                 *)0x0) {
                              (**(code **)(*(long *)local_68._M_head_impl + 8))();
                            }
                          }
                          if (local_50 !=
                              (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              0x0) {
                            std::
                            default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                            ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                          *)&local_50,local_50);
                          }
                          if (iVar1 != (internal)0x0) {
                            local_68._M_head_impl._0_4_ = 2;
                            local_70.data_._0_4_ =
                                 (float)protobuf::internal::ExtensionSet::ExtensionSize
                                                  (&(this->_impl_)._extensions_,
                                                   proto2_unittest::packed_enum_extension_lite);
                            testing::internal::CmpHelperEQ<int,int>
                                      ((internal *)local_58,"2",
                                       "message.ExtensionSize(unittest::packed_enum_extension_lite)"
                                       ,(int *)&local_68,(int *)&local_70);
                            iVar1 = local_58[0];
                            if (local_58[0] == (internal)0x0) {
                              testing::Message::Message((Message *)&local_68);
                              if (local_50 ==
                                  (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)0x0) {
                                pcVar3 = anon_var_dwarf_a12c75 + 5;
                              }
                              else {
                                pcVar3 = (local_50->_M_dataplus)._M_p;
                              }
                              testing::internal::AssertHelper::AssertHelper
                                        (&local_70,kFatalFailure,
                                         "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util_lite.cc"
                                         ,0x710,pcVar3);
                              testing::internal::AssertHelper::operator=
                                        (&local_70,(Message *)&local_68);
                              testing::internal::AssertHelper::~AssertHelper(&local_70);
                              if (local_68._M_head_impl !=
                                  (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)0x0) {
                                (**(code **)(*(long *)local_68._M_head_impl + 8))();
                              }
                            }
                            if (local_50 !=
                                (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )0x0) {
                              std::
                              default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                              ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                            *)&local_50,local_50);
                            }
                            if (iVar1 != (internal)0x0) {
                              local_68._M_head_impl._0_4_ = 0x259;
                              local_70.data_._0_4_ =
                                   (float)protobuf::internal::ExtensionSet::GetRepeatedInt32
                                                    (&(this->_impl_)._extensions_,
                                                     proto2_unittest::packed_int32_extension_lite,0)
                              ;
                              testing::internal::CmpHelperEQ<int,int>
                                        ((internal *)local_58,"601",
                                         "message.GetExtension(unittest::packed_int32_extension_lite, 0)"
                                         ,(int *)&local_68,(int *)&local_70);
                              if (local_58[0] == (internal)0x0) {
                                testing::Message::Message((Message *)&local_68);
                                if (local_50 ==
                                    (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)0x0) {
                                  pcVar3 = anon_var_dwarf_a12c75 + 5;
                                }
                                else {
                                  pcVar3 = (local_50->_M_dataplus)._M_p;
                                }
                                testing::internal::AssertHelper::AssertHelper
                                          (&local_70,kNonFatalFailure,
                                           "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util_lite.cc"
                                           ,0x713,pcVar3);
                                testing::internal::AssertHelper::operator=
                                          (&local_70,(Message *)&local_68);
                                testing::internal::AssertHelper::~AssertHelper(&local_70);
                                if (local_68._M_head_impl !=
                                    (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)0x0) {
                                  (**(code **)(*(long *)local_68._M_head_impl + 8))();
                                }
                              }
                              if (local_50 !=
                                  (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)0x0) {
                                std::
                                default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                              *)&local_50,local_50);
                              }
                              local_70.data_._0_4_ = 8.43582e-43;
                              local_68._M_head_impl =
                                   (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>
                                    *)protobuf::internal::ExtensionSet::GetRepeatedInt64
                                                (&(this->_impl_)._extensions_,
                                                 proto2_unittest::packed_int64_extension_lite,0);
                              testing::internal::CmpHelperEQ<int,long>
                                        ((internal *)local_58,"602",
                                         "message.GetExtension(unittest::packed_int64_extension_lite, 0)"
                                         ,(int *)&local_70,(long *)&local_68);
                              if (local_58[0] == (internal)0x0) {
                                testing::Message::Message((Message *)&local_68);
                                if (local_50 ==
                                    (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)0x0) {
                                  pcVar3 = anon_var_dwarf_a12c75 + 5;
                                }
                                else {
                                  pcVar3 = (local_50->_M_dataplus)._M_p;
                                }
                                testing::internal::AssertHelper::AssertHelper
                                          (&local_70,kNonFatalFailure,
                                           "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util_lite.cc"
                                           ,0x715,pcVar3);
                                testing::internal::AssertHelper::operator=
                                          (&local_70,(Message *)&local_68);
                                testing::internal::AssertHelper::~AssertHelper(&local_70);
                                if (local_68._M_head_impl !=
                                    (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)0x0) {
                                  (**(code **)(*(long *)local_68._M_head_impl + 8))();
                                }
                              }
                              if (local_50 !=
                                  (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)0x0) {
                                std::
                                default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                              *)&local_50,local_50);
                              }
                              local_68._M_head_impl._0_4_ = 0x25b;
                              local_70.data_._0_4_ =
                                   (float)protobuf::internal::ExtensionSet::GetRepeatedUInt32
                                                    (&(this->_impl_)._extensions_,
                                                     proto2_unittest::packed_uint32_extension_lite,0
                                                    );
                              testing::internal::CmpHelperEQ<int,unsigned_int>
                                        ((internal *)local_58,"603",
                                         "message.GetExtension(unittest::packed_uint32_extension_lite, 0)"
                                         ,(int *)&local_68,(uint *)&local_70);
                              if (local_58[0] == (internal)0x0) {
                                testing::Message::Message((Message *)&local_68);
                                if (local_50 ==
                                    (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)0x0) {
                                  pcVar3 = anon_var_dwarf_a12c75 + 5;
                                }
                                else {
                                  pcVar3 = (local_50->_M_dataplus)._M_p;
                                }
                                testing::internal::AssertHelper::AssertHelper
                                          (&local_70,kNonFatalFailure,
                                           "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util_lite.cc"
                                           ,0x717,pcVar3);
                                testing::internal::AssertHelper::operator=
                                          (&local_70,(Message *)&local_68);
                                testing::internal::AssertHelper::~AssertHelper(&local_70);
                                if (local_68._M_head_impl !=
                                    (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)0x0) {
                                  (**(code **)(*(long *)local_68._M_head_impl + 8))();
                                }
                              }
                              if (local_50 !=
                                  (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)0x0) {
                                std::
                                default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                              *)&local_50,local_50);
                              }
                              local_70.data_._0_4_ = 8.46384e-43;
                              local_68._M_head_impl =
                                   (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>
                                    *)protobuf::internal::ExtensionSet::GetRepeatedUInt64
                                                (&(this->_impl_)._extensions_,
                                                 proto2_unittest::packed_uint64_extension_lite,0);
                              testing::internal::CmpHelperEQ<int,unsigned_long>
                                        ((internal *)local_58,"604",
                                         "message.GetExtension(unittest::packed_uint64_extension_lite, 0)"
                                         ,(int *)&local_70,(unsigned_long *)&local_68);
                              if (local_58[0] == (internal)0x0) {
                                testing::Message::Message((Message *)&local_68);
                                if (local_50 ==
                                    (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)0x0) {
                                  pcVar3 = anon_var_dwarf_a12c75 + 5;
                                }
                                else {
                                  pcVar3 = (local_50->_M_dataplus)._M_p;
                                }
                                testing::internal::AssertHelper::AssertHelper
                                          (&local_70,kNonFatalFailure,
                                           "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util_lite.cc"
                                           ,0x719,pcVar3);
                                testing::internal::AssertHelper::operator=
                                          (&local_70,(Message *)&local_68);
                                testing::internal::AssertHelper::~AssertHelper(&local_70);
                                if (local_68._M_head_impl !=
                                    (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)0x0) {
                                  (**(code **)(*(long *)local_68._M_head_impl + 8))();
                                }
                              }
                              if (local_50 !=
                                  (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)0x0) {
                                std::
                                default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                              *)&local_50,local_50);
                              }
                              local_68._M_head_impl._0_4_ = 0x25d;
                              local_70.data_._0_4_ =
                                   (float)protobuf::internal::ExtensionSet::GetRepeatedInt32
                                                    (&(this->_impl_)._extensions_,
                                                     proto2_unittest::packed_sint32_extension_lite,0
                                                    );
                              testing::internal::CmpHelperEQ<int,int>
                                        ((internal *)local_58,"605",
                                         "message.GetExtension(unittest::packed_sint32_extension_lite, 0)"
                                         ,(int *)&local_68,(int *)&local_70);
                              if (local_58[0] == (internal)0x0) {
                                testing::Message::Message((Message *)&local_68);
                                if (local_50 ==
                                    (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)0x0) {
                                  pcVar3 = anon_var_dwarf_a12c75 + 5;
                                }
                                else {
                                  pcVar3 = (local_50->_M_dataplus)._M_p;
                                }
                                testing::internal::AssertHelper::AssertHelper
                                          (&local_70,kNonFatalFailure,
                                           "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util_lite.cc"
                                           ,0x71b,pcVar3);
                                testing::internal::AssertHelper::operator=
                                          (&local_70,(Message *)&local_68);
                                testing::internal::AssertHelper::~AssertHelper(&local_70);
                                if (local_68._M_head_impl !=
                                    (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)0x0) {
                                  (**(code **)(*(long *)local_68._M_head_impl + 8))();
                                }
                              }
                              if (local_50 !=
                                  (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)0x0) {
                                std::
                                default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                              *)&local_50,local_50);
                              }
                              local_70.data_._0_4_ = 8.49187e-43;
                              local_68._M_head_impl =
                                   (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>
                                    *)protobuf::internal::ExtensionSet::GetRepeatedInt64
                                                (&(this->_impl_)._extensions_,
                                                 proto2_unittest::packed_sint64_extension_lite,0);
                              testing::internal::CmpHelperEQ<int,long>
                                        ((internal *)local_58,"606",
                                         "message.GetExtension(unittest::packed_sint64_extension_lite, 0)"
                                         ,(int *)&local_70,(long *)&local_68);
                              if (local_58[0] == (internal)0x0) {
                                testing::Message::Message((Message *)&local_68);
                                if (local_50 ==
                                    (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)0x0) {
                                  pcVar3 = anon_var_dwarf_a12c75 + 5;
                                }
                                else {
                                  pcVar3 = (local_50->_M_dataplus)._M_p;
                                }
                                testing::internal::AssertHelper::AssertHelper
                                          (&local_70,kNonFatalFailure,
                                           "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util_lite.cc"
                                           ,0x71d,pcVar3);
                                testing::internal::AssertHelper::operator=
                                          (&local_70,(Message *)&local_68);
                                testing::internal::AssertHelper::~AssertHelper(&local_70);
                                if (local_68._M_head_impl !=
                                    (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)0x0) {
                                  (**(code **)(*(long *)local_68._M_head_impl + 8))();
                                }
                              }
                              if (local_50 !=
                                  (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)0x0) {
                                std::
                                default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                              *)&local_50,local_50);
                              }
                              local_68._M_head_impl._0_4_ = 0x25f;
                              local_70.data_._0_4_ =
                                   (float)protobuf::internal::ExtensionSet::GetRepeatedUInt32
                                                    (&(this->_impl_)._extensions_,
                                                     proto2_unittest::packed_fixed32_extension_lite,
                                                     0);
                              testing::internal::CmpHelperEQ<int,unsigned_int>
                                        ((internal *)local_58,"607",
                                         "message.GetExtension(unittest::packed_fixed32_extension_lite, 0)"
                                         ,(int *)&local_68,(uint *)&local_70);
                              if (local_58[0] == (internal)0x0) {
                                testing::Message::Message((Message *)&local_68);
                                if (local_50 ==
                                    (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)0x0) {
                                  pcVar3 = anon_var_dwarf_a12c75 + 5;
                                }
                                else {
                                  pcVar3 = (local_50->_M_dataplus)._M_p;
                                }
                                testing::internal::AssertHelper::AssertHelper
                                          (&local_70,kNonFatalFailure,
                                           "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util_lite.cc"
                                           ,0x71f,pcVar3);
                                testing::internal::AssertHelper::operator=
                                          (&local_70,(Message *)&local_68);
                                testing::internal::AssertHelper::~AssertHelper(&local_70);
                                if (local_68._M_head_impl !=
                                    (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)0x0) {
                                  (**(code **)(*(long *)local_68._M_head_impl + 8))();
                                }
                              }
                              if (local_50 !=
                                  (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)0x0) {
                                std::
                                default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                              *)&local_50,local_50);
                              }
                              local_70.data_._0_4_ = 8.51989e-43;
                              local_68._M_head_impl =
                                   (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>
                                    *)protobuf::internal::ExtensionSet::GetRepeatedUInt64
                                                (&(this->_impl_)._extensions_,
                                                 proto2_unittest::packed_fixed64_extension_lite,0);
                              testing::internal::CmpHelperEQ<int,unsigned_long>
                                        ((internal *)local_58,"608",
                                         "message.GetExtension(unittest::packed_fixed64_extension_lite, 0)"
                                         ,(int *)&local_70,(unsigned_long *)&local_68);
                              if (local_58[0] == (internal)0x0) {
                                testing::Message::Message((Message *)&local_68);
                                if (local_50 ==
                                    (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)0x0) {
                                  pcVar3 = anon_var_dwarf_a12c75 + 5;
                                }
                                else {
                                  pcVar3 = (local_50->_M_dataplus)._M_p;
                                }
                                testing::internal::AssertHelper::AssertHelper
                                          (&local_70,kNonFatalFailure,
                                           "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util_lite.cc"
                                           ,0x721,pcVar3);
                                testing::internal::AssertHelper::operator=
                                          (&local_70,(Message *)&local_68);
                                testing::internal::AssertHelper::~AssertHelper(&local_70);
                                if (local_68._M_head_impl !=
                                    (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)0x0) {
                                  (**(code **)(*(long *)local_68._M_head_impl + 8))();
                                }
                              }
                              if (local_50 !=
                                  (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)0x0) {
                                std::
                                default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                              *)&local_50,local_50);
                              }
                              local_68._M_head_impl._0_4_ = 0x261;
                              local_70.data_._0_4_ =
                                   (float)protobuf::internal::ExtensionSet::GetRepeatedInt32
                                                    (&(this->_impl_)._extensions_,
                                                     proto2_unittest::packed_sfixed32_extension_lite
                                                     ,0);
                              testing::internal::CmpHelperEQ<int,int>
                                        ((internal *)local_58,"609",
                                         "message.GetExtension(unittest::packed_sfixed32_extension_lite, 0)"
                                         ,(int *)&local_68,(int *)&local_70);
                              if (local_58[0] == (internal)0x0) {
                                testing::Message::Message((Message *)&local_68);
                                if (local_50 ==
                                    (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)0x0) {
                                  pcVar3 = anon_var_dwarf_a12c75 + 5;
                                }
                                else {
                                  pcVar3 = (local_50->_M_dataplus)._M_p;
                                }
                                testing::internal::AssertHelper::AssertHelper
                                          (&local_70,kNonFatalFailure,
                                           "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util_lite.cc"
                                           ,0x723,pcVar3);
                                testing::internal::AssertHelper::operator=
                                          (&local_70,(Message *)&local_68);
                                testing::internal::AssertHelper::~AssertHelper(&local_70);
                                if (local_68._M_head_impl !=
                                    (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)0x0) {
                                  (**(code **)(*(long *)local_68._M_head_impl + 8))();
                                }
                              }
                              if (local_50 !=
                                  (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)0x0) {
                                std::
                                default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                              *)&local_50,local_50);
                              }
                              local_70.data_._0_4_ = 8.54792e-43;
                              local_68._M_head_impl =
                                   (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>
                                    *)protobuf::internal::ExtensionSet::GetRepeatedInt64
                                                (&(this->_impl_)._extensions_,
                                                 proto2_unittest::packed_sfixed64_extension_lite,0);
                              testing::internal::CmpHelperEQ<int,long>
                                        ((internal *)local_58,"610",
                                         "message.GetExtension(unittest::packed_sfixed64_extension_lite, 0)"
                                         ,(int *)&local_70,(long *)&local_68);
                              if (local_58[0] == (internal)0x0) {
                                testing::Message::Message((Message *)&local_68);
                                if (local_50 ==
                                    (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)0x0) {
                                  pcVar3 = anon_var_dwarf_a12c75 + 5;
                                }
                                else {
                                  pcVar3 = (local_50->_M_dataplus)._M_p;
                                }
                                testing::internal::AssertHelper::AssertHelper
                                          (&local_70,kNonFatalFailure,
                                           "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util_lite.cc"
                                           ,0x725,pcVar3);
                                testing::internal::AssertHelper::operator=
                                          (&local_70,(Message *)&local_68);
                                testing::internal::AssertHelper::~AssertHelper(&local_70);
                                if (local_68._M_head_impl !=
                                    (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)0x0) {
                                  (**(code **)(*(long *)local_68._M_head_impl + 8))();
                                }
                              }
                              if (local_50 !=
                                  (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)0x0) {
                                std::
                                default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                              *)&local_50,local_50);
                              }
                              local_68._M_head_impl._0_4_ = 0x263;
                              local_70.data_._0_4_ =
                                   protobuf::internal::ExtensionSet::GetRepeatedFloat
                                             (&(this->_impl_)._extensions_,
                                              proto2_unittest::packed_float_extension_lite,0);
                              testing::internal::CmpHelperEQ<int,float>
                                        ((internal *)local_58,"611",
                                         "message.GetExtension(unittest::packed_float_extension_lite, 0)"
                                         ,(int *)&local_68,(float *)&local_70);
                              if (local_58[0] == (internal)0x0) {
                                testing::Message::Message((Message *)&local_68);
                                if (local_50 ==
                                    (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)0x0) {
                                  pcVar3 = anon_var_dwarf_a12c75 + 5;
                                }
                                else {
                                  pcVar3 = (local_50->_M_dataplus)._M_p;
                                }
                                testing::internal::AssertHelper::AssertHelper
                                          (&local_70,kNonFatalFailure,
                                           "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util_lite.cc"
                                           ,0x727,pcVar3);
                                testing::internal::AssertHelper::operator=
                                          (&local_70,(Message *)&local_68);
                                testing::internal::AssertHelper::~AssertHelper(&local_70);
                                if (local_68._M_head_impl !=
                                    (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)0x0) {
                                  (**(code **)(*(long *)local_68._M_head_impl + 8))();
                                }
                              }
                              if (local_50 !=
                                  (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)0x0) {
                                std::
                                default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                              *)&local_50,local_50);
                              }
                              local_70.data_._0_4_ = 8.57595e-43;
                              local_68._M_head_impl =
                                   (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>
                                    *)protobuf::internal::ExtensionSet::GetRepeatedDouble
                                                (&(this->_impl_)._extensions_,
                                                 proto2_unittest::packed_double_extension_lite,0);
                              testing::internal::CmpHelperEQ<int,double>
                                        ((internal *)local_58,"612",
                                         "message.GetExtension(unittest::packed_double_extension_lite, 0)"
                                         ,(int *)&local_70,(double *)&local_68);
                              if (local_58[0] == (internal)0x0) {
                                testing::Message::Message((Message *)&local_68);
                                if (local_50 ==
                                    (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)0x0) {
                                  pcVar3 = anon_var_dwarf_a12c75 + 5;
                                }
                                else {
                                  pcVar3 = (local_50->_M_dataplus)._M_p;
                                }
                                testing::internal::AssertHelper::AssertHelper
                                          (&local_70,kNonFatalFailure,
                                           "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util_lite.cc"
                                           ,0x729,pcVar3);
                                testing::internal::AssertHelper::operator=
                                          (&local_70,(Message *)&local_68);
                                testing::internal::AssertHelper::~AssertHelper(&local_70);
                                if (local_68._M_head_impl !=
                                    (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)0x0) {
                                  (**(code **)(*(long *)local_68._M_head_impl + 8))();
                                }
                              }
                              if (local_50 !=
                                  (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)0x0) {
                                std::
                                default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                              *)&local_50,local_50);
                              }
                              local_68._M_head_impl._0_1_ = 1;
                              bVar2 = protobuf::internal::ExtensionSet::GetRepeatedBool
                                                (&(this->_impl_)._extensions_,
                                                 proto2_unittest::packed_bool_extension_lite,0);
                              local_70.data_._0_4_ = (float)CONCAT31(local_70.data_._1_3_,bVar2);
                              testing::internal::CmpHelperEQ<bool,bool>
                                        ((internal *)local_58,"true",
                                         "message.GetExtension(unittest::packed_bool_extension_lite, 0)"
                                         ,(bool *)&local_68,(bool *)&local_70);
                              if (local_58[0] == (internal)0x0) {
                                testing::Message::Message((Message *)&local_68);
                                if (local_50 ==
                                    (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)0x0) {
                                  pcVar3 = anon_var_dwarf_a12c75 + 5;
                                }
                                else {
                                  pcVar3 = (local_50->_M_dataplus)._M_p;
                                }
                                testing::internal::AssertHelper::AssertHelper
                                          (&local_70,kNonFatalFailure,
                                           "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util_lite.cc"
                                           ,0x72b,pcVar3);
                                testing::internal::AssertHelper::operator=
                                          (&local_70,(Message *)&local_68);
                                testing::internal::AssertHelper::~AssertHelper(&local_70);
                                if (local_68._M_head_impl !=
                                    (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)0x0) {
                                  (**(code **)(*(long *)local_68._M_head_impl + 8))();
                                }
                              }
                              if (local_50 !=
                                  (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)0x0) {
                                std::
                                default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                              *)&local_50,local_50);
                              }
                              local_68._M_head_impl._0_4_ = 5;
                              local_70.data_._0_4_ =
                                   (float)protobuf::internal::ExtensionSet::GetRepeatedEnum
                                                    (&(this->_impl_)._extensions_,
                                                     proto2_unittest::packed_enum_extension_lite,0);
                              testing::internal::
                              CmpHelperEQ<proto2_unittest::ForeignEnumLite,proto2_unittest::ForeignEnumLite>
                                        ((internal *)local_58,"unittest::FOREIGN_LITE_BAR",
                                         "message.GetExtension(unittest::packed_enum_extension_lite, 0)"
                                         ,(ForeignEnumLite *)&local_68,(ForeignEnumLite *)&local_70)
                              ;
                              if (local_58[0] == (internal)0x0) {
                                testing::Message::Message((Message *)&local_68);
                                if (local_50 ==
                                    (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)0x0) {
                                  pcVar3 = anon_var_dwarf_a12c75 + 5;
                                }
                                else {
                                  pcVar3 = (local_50->_M_dataplus)._M_p;
                                }
                                testing::internal::AssertHelper::AssertHelper
                                          (&local_70,kNonFatalFailure,
                                           "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util_lite.cc"
                                           ,0x72d,pcVar3);
                                testing::internal::AssertHelper::operator=
                                          (&local_70,(Message *)&local_68);
                                testing::internal::AssertHelper::~AssertHelper(&local_70);
                                if (local_68._M_head_impl !=
                                    (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)0x0) {
                                  (**(code **)(*(long *)local_68._M_head_impl + 8))();
                                }
                              }
                              if (local_50 !=
                                  (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)0x0) {
                                std::
                                default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                              *)&local_50,local_50);
                              }
                              local_68._M_head_impl._0_4_ = 0x2bd;
                              local_70.data_._0_4_ =
                                   (float)protobuf::internal::ExtensionSet::GetRepeatedInt32
                                                    (&(this->_impl_)._extensions_,
                                                     proto2_unittest::packed_int32_extension_lite,1)
                              ;
                              testing::internal::CmpHelperEQ<int,int>
                                        ((internal *)local_58,"701",
                                         "message.GetExtension(unittest::packed_int32_extension_lite, 1)"
                                         ,(int *)&local_68,(int *)&local_70);
                              if (local_58[0] == (internal)0x0) {
                                testing::Message::Message((Message *)&local_68);
                                if (local_50 ==
                                    (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)0x0) {
                                  pcVar3 = anon_var_dwarf_a12c75 + 5;
                                }
                                else {
                                  pcVar3 = (local_50->_M_dataplus)._M_p;
                                }
                                testing::internal::AssertHelper::AssertHelper
                                          (&local_70,kNonFatalFailure,
                                           "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util_lite.cc"
                                           ,0x72f,pcVar3);
                                testing::internal::AssertHelper::operator=
                                          (&local_70,(Message *)&local_68);
                                testing::internal::AssertHelper::~AssertHelper(&local_70);
                                if (local_68._M_head_impl !=
                                    (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)0x0) {
                                  (**(code **)(*(long *)local_68._M_head_impl + 8))();
                                }
                              }
                              if (local_50 !=
                                  (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)0x0) {
                                std::
                                default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                              *)&local_50,local_50);
                              }
                              local_70.data_._0_4_ = 9.83712e-43;
                              local_68._M_head_impl =
                                   (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>
                                    *)protobuf::internal::ExtensionSet::GetRepeatedInt64
                                                (&(this->_impl_)._extensions_,
                                                 proto2_unittest::packed_int64_extension_lite,1);
                              testing::internal::CmpHelperEQ<int,long>
                                        ((internal *)local_58,"702",
                                         "message.GetExtension(unittest::packed_int64_extension_lite, 1)"
                                         ,(int *)&local_70,(long *)&local_68);
                              if (local_58[0] == (internal)0x0) {
                                testing::Message::Message((Message *)&local_68);
                                if (local_50 ==
                                    (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)0x0) {
                                  pcVar3 = anon_var_dwarf_a12c75 + 5;
                                }
                                else {
                                  pcVar3 = (local_50->_M_dataplus)._M_p;
                                }
                                testing::internal::AssertHelper::AssertHelper
                                          (&local_70,kNonFatalFailure,
                                           "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util_lite.cc"
                                           ,0x731,pcVar3);
                                testing::internal::AssertHelper::operator=
                                          (&local_70,(Message *)&local_68);
                                testing::internal::AssertHelper::~AssertHelper(&local_70);
                                if (local_68._M_head_impl !=
                                    (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)0x0) {
                                  (**(code **)(*(long *)local_68._M_head_impl + 8))();
                                }
                              }
                              if (local_50 !=
                                  (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)0x0) {
                                std::
                                default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                              *)&local_50,local_50);
                              }
                              local_68._M_head_impl._0_4_ = 0x2bf;
                              local_70.data_._0_4_ =
                                   (float)protobuf::internal::ExtensionSet::GetRepeatedUInt32
                                                    (&(this->_impl_)._extensions_,
                                                     proto2_unittest::packed_uint32_extension_lite,1
                                                    );
                              testing::internal::CmpHelperEQ<int,unsigned_int>
                                        ((internal *)local_58,"703",
                                         "message.GetExtension(unittest::packed_uint32_extension_lite, 1)"
                                         ,(int *)&local_68,(uint *)&local_70);
                              if (local_58[0] == (internal)0x0) {
                                testing::Message::Message((Message *)&local_68);
                                if (local_50 ==
                                    (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)0x0) {
                                  pcVar3 = anon_var_dwarf_a12c75 + 5;
                                }
                                else {
                                  pcVar3 = (local_50->_M_dataplus)._M_p;
                                }
                                testing::internal::AssertHelper::AssertHelper
                                          (&local_70,kNonFatalFailure,
                                           "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util_lite.cc"
                                           ,0x733,pcVar3);
                                testing::internal::AssertHelper::operator=
                                          (&local_70,(Message *)&local_68);
                                testing::internal::AssertHelper::~AssertHelper(&local_70);
                                if (local_68._M_head_impl !=
                                    (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)0x0) {
                                  (**(code **)(*(long *)local_68._M_head_impl + 8))();
                                }
                              }
                              if (local_50 !=
                                  (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)0x0) {
                                std::
                                default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                              *)&local_50,local_50);
                              }
                              local_70.data_._0_4_ = 9.86514e-43;
                              local_68._M_head_impl =
                                   (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>
                                    *)protobuf::internal::ExtensionSet::GetRepeatedUInt64
                                                (&(this->_impl_)._extensions_,
                                                 proto2_unittest::packed_uint64_extension_lite,1);
                              testing::internal::CmpHelperEQ<int,unsigned_long>
                                        ((internal *)local_58,"704",
                                         "message.GetExtension(unittest::packed_uint64_extension_lite, 1)"
                                         ,(int *)&local_70,(unsigned_long *)&local_68);
                              if (local_58[0] == (internal)0x0) {
                                testing::Message::Message((Message *)&local_68);
                                if (local_50 ==
                                    (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)0x0) {
                                  pcVar3 = anon_var_dwarf_a12c75 + 5;
                                }
                                else {
                                  pcVar3 = (local_50->_M_dataplus)._M_p;
                                }
                                testing::internal::AssertHelper::AssertHelper
                                          (&local_70,kNonFatalFailure,
                                           "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util_lite.cc"
                                           ,0x735,pcVar3);
                                testing::internal::AssertHelper::operator=
                                          (&local_70,(Message *)&local_68);
                                testing::internal::AssertHelper::~AssertHelper(&local_70);
                                if (local_68._M_head_impl !=
                                    (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)0x0) {
                                  (**(code **)(*(long *)local_68._M_head_impl + 8))();
                                }
                              }
                              if (local_50 !=
                                  (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)0x0) {
                                std::
                                default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                              *)&local_50,local_50);
                              }
                              local_68._M_head_impl._0_4_ = 0x2c1;
                              local_70.data_._0_4_ =
                                   (float)protobuf::internal::ExtensionSet::GetRepeatedInt32
                                                    (&(this->_impl_)._extensions_,
                                                     proto2_unittest::packed_sint32_extension_lite,1
                                                    );
                              testing::internal::CmpHelperEQ<int,int>
                                        ((internal *)local_58,"705",
                                         "message.GetExtension(unittest::packed_sint32_extension_lite, 1)"
                                         ,(int *)&local_68,(int *)&local_70);
                              if (local_58[0] == (internal)0x0) {
                                testing::Message::Message((Message *)&local_68);
                                if (local_50 ==
                                    (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)0x0) {
                                  pcVar3 = anon_var_dwarf_a12c75 + 5;
                                }
                                else {
                                  pcVar3 = (local_50->_M_dataplus)._M_p;
                                }
                                testing::internal::AssertHelper::AssertHelper
                                          (&local_70,kNonFatalFailure,
                                           "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util_lite.cc"
                                           ,0x737,pcVar3);
                                testing::internal::AssertHelper::operator=
                                          (&local_70,(Message *)&local_68);
                                testing::internal::AssertHelper::~AssertHelper(&local_70);
                                if (local_68._M_head_impl !=
                                    (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)0x0) {
                                  (**(code **)(*(long *)local_68._M_head_impl + 8))();
                                }
                              }
                              if (local_50 !=
                                  (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)0x0) {
                                std::
                                default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                              *)&local_50,local_50);
                              }
                              local_70.data_._0_4_ = 9.89317e-43;
                              local_68._M_head_impl =
                                   (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>
                                    *)protobuf::internal::ExtensionSet::GetRepeatedInt64
                                                (&(this->_impl_)._extensions_,
                                                 proto2_unittest::packed_sint64_extension_lite,1);
                              testing::internal::CmpHelperEQ<int,long>
                                        ((internal *)local_58,"706",
                                         "message.GetExtension(unittest::packed_sint64_extension_lite, 1)"
                                         ,(int *)&local_70,(long *)&local_68);
                              if (local_58[0] == (internal)0x0) {
                                testing::Message::Message((Message *)&local_68);
                                if (local_50 ==
                                    (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)0x0) {
                                  pcVar3 = anon_var_dwarf_a12c75 + 5;
                                }
                                else {
                                  pcVar3 = (local_50->_M_dataplus)._M_p;
                                }
                                testing::internal::AssertHelper::AssertHelper
                                          (&local_70,kNonFatalFailure,
                                           "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util_lite.cc"
                                           ,0x739,pcVar3);
                                testing::internal::AssertHelper::operator=
                                          (&local_70,(Message *)&local_68);
                                testing::internal::AssertHelper::~AssertHelper(&local_70);
                                if (local_68._M_head_impl !=
                                    (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)0x0) {
                                  (**(code **)(*(long *)local_68._M_head_impl + 8))();
                                }
                              }
                              if (local_50 !=
                                  (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)0x0) {
                                std::
                                default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                              *)&local_50,local_50);
                              }
                              local_68._M_head_impl._0_4_ = 0x2c3;
                              local_70.data_._0_4_ =
                                   (float)protobuf::internal::ExtensionSet::GetRepeatedUInt32
                                                    (&(this->_impl_)._extensions_,
                                                     proto2_unittest::packed_fixed32_extension_lite,
                                                     1);
                              testing::internal::CmpHelperEQ<int,unsigned_int>
                                        ((internal *)local_58,"707",
                                         "message.GetExtension(unittest::packed_fixed32_extension_lite, 1)"
                                         ,(int *)&local_68,(uint *)&local_70);
                              if (local_58[0] == (internal)0x0) {
                                testing::Message::Message((Message *)&local_68);
                                if (local_50 ==
                                    (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)0x0) {
                                  pcVar3 = anon_var_dwarf_a12c75 + 5;
                                }
                                else {
                                  pcVar3 = (local_50->_M_dataplus)._M_p;
                                }
                                testing::internal::AssertHelper::AssertHelper
                                          (&local_70,kNonFatalFailure,
                                           "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util_lite.cc"
                                           ,0x73b,pcVar3);
                                testing::internal::AssertHelper::operator=
                                          (&local_70,(Message *)&local_68);
                                testing::internal::AssertHelper::~AssertHelper(&local_70);
                                if (local_68._M_head_impl !=
                                    (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)0x0) {
                                  (**(code **)(*(long *)local_68._M_head_impl + 8))();
                                }
                              }
                              if (local_50 !=
                                  (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)0x0) {
                                std::
                                default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                              *)&local_50,local_50);
                              }
                              local_70.data_._0_4_ = 9.92119e-43;
                              local_68._M_head_impl =
                                   (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>
                                    *)protobuf::internal::ExtensionSet::GetRepeatedUInt64
                                                (&(this->_impl_)._extensions_,
                                                 proto2_unittest::packed_fixed64_extension_lite,1);
                              testing::internal::CmpHelperEQ<int,unsigned_long>
                                        ((internal *)local_58,"708",
                                         "message.GetExtension(unittest::packed_fixed64_extension_lite, 1)"
                                         ,(int *)&local_70,(unsigned_long *)&local_68);
                              if (local_58[0] == (internal)0x0) {
                                testing::Message::Message((Message *)&local_68);
                                if (local_50 ==
                                    (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)0x0) {
                                  pcVar3 = anon_var_dwarf_a12c75 + 5;
                                }
                                else {
                                  pcVar3 = (local_50->_M_dataplus)._M_p;
                                }
                                testing::internal::AssertHelper::AssertHelper
                                          (&local_70,kNonFatalFailure,
                                           "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util_lite.cc"
                                           ,0x73d,pcVar3);
                                testing::internal::AssertHelper::operator=
                                          (&local_70,(Message *)&local_68);
                                testing::internal::AssertHelper::~AssertHelper(&local_70);
                                if (local_68._M_head_impl !=
                                    (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)0x0) {
                                  (**(code **)(*(long *)local_68._M_head_impl + 8))();
                                }
                              }
                              if (local_50 !=
                                  (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)0x0) {
                                std::
                                default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                              *)&local_50,local_50);
                              }
                              local_68._M_head_impl._0_4_ = 0x2c5;
                              local_70.data_._0_4_ =
                                   (float)protobuf::internal::ExtensionSet::GetRepeatedInt32
                                                    (&(this->_impl_)._extensions_,
                                                     proto2_unittest::packed_sfixed32_extension_lite
                                                     ,1);
                              testing::internal::CmpHelperEQ<int,int>
                                        ((internal *)local_58,"709",
                                         "message.GetExtension(unittest::packed_sfixed32_extension_lite, 1)"
                                         ,(int *)&local_68,(int *)&local_70);
                              if (local_58[0] == (internal)0x0) {
                                testing::Message::Message((Message *)&local_68);
                                if (local_50 ==
                                    (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)0x0) {
                                  pcVar3 = anon_var_dwarf_a12c75 + 5;
                                }
                                else {
                                  pcVar3 = (local_50->_M_dataplus)._M_p;
                                }
                                testing::internal::AssertHelper::AssertHelper
                                          (&local_70,kNonFatalFailure,
                                           "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util_lite.cc"
                                           ,0x73f,pcVar3);
                                testing::internal::AssertHelper::operator=
                                          (&local_70,(Message *)&local_68);
                                testing::internal::AssertHelper::~AssertHelper(&local_70);
                                if (local_68._M_head_impl !=
                                    (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)0x0) {
                                  (**(code **)(*(long *)local_68._M_head_impl + 8))();
                                }
                              }
                              if (local_50 !=
                                  (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)0x0) {
                                std::
                                default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                              *)&local_50,local_50);
                              }
                              local_70.data_._0_4_ = 9.94922e-43;
                              local_68._M_head_impl =
                                   (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>
                                    *)protobuf::internal::ExtensionSet::GetRepeatedInt64
                                                (&(this->_impl_)._extensions_,
                                                 proto2_unittest::packed_sfixed64_extension_lite,1);
                              testing::internal::CmpHelperEQ<int,long>
                                        ((internal *)local_58,"710",
                                         "message.GetExtension(unittest::packed_sfixed64_extension_lite, 1)"
                                         ,(int *)&local_70,(long *)&local_68);
                              if (local_58[0] == (internal)0x0) {
                                testing::Message::Message((Message *)&local_68);
                                if (local_50 ==
                                    (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)0x0) {
                                  pcVar3 = anon_var_dwarf_a12c75 + 5;
                                }
                                else {
                                  pcVar3 = (local_50->_M_dataplus)._M_p;
                                }
                                testing::internal::AssertHelper::AssertHelper
                                          (&local_70,kNonFatalFailure,
                                           "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util_lite.cc"
                                           ,0x741,pcVar3);
                                testing::internal::AssertHelper::operator=
                                          (&local_70,(Message *)&local_68);
                                testing::internal::AssertHelper::~AssertHelper(&local_70);
                                if (local_68._M_head_impl !=
                                    (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)0x0) {
                                  (**(code **)(*(long *)local_68._M_head_impl + 8))();
                                }
                              }
                              if (local_50 !=
                                  (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)0x0) {
                                std::
                                default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                              *)&local_50,local_50);
                              }
                              local_68._M_head_impl._0_4_ = 0x2c7;
                              local_70.data_._0_4_ =
                                   protobuf::internal::ExtensionSet::GetRepeatedFloat
                                             (&(this->_impl_)._extensions_,
                                              proto2_unittest::packed_float_extension_lite,1);
                              testing::internal::CmpHelperEQ<int,float>
                                        ((internal *)local_58,"711",
                                         "message.GetExtension(unittest::packed_float_extension_lite, 1)"
                                         ,(int *)&local_68,(float *)&local_70);
                              if (local_58[0] == (internal)0x0) {
                                testing::Message::Message((Message *)&local_68);
                                if (local_50 ==
                                    (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)0x0) {
                                  pcVar3 = anon_var_dwarf_a12c75 + 5;
                                }
                                else {
                                  pcVar3 = (local_50->_M_dataplus)._M_p;
                                }
                                testing::internal::AssertHelper::AssertHelper
                                          (&local_70,kNonFatalFailure,
                                           "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util_lite.cc"
                                           ,0x743,pcVar3);
                                testing::internal::AssertHelper::operator=
                                          (&local_70,(Message *)&local_68);
                                testing::internal::AssertHelper::~AssertHelper(&local_70);
                                if (local_68._M_head_impl !=
                                    (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)0x0) {
                                  (**(code **)(*(long *)local_68._M_head_impl + 8))();
                                }
                              }
                              if (local_50 !=
                                  (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)0x0) {
                                std::
                                default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                              *)&local_50,local_50);
                              }
                              local_70.data_._0_4_ = 9.97725e-43;
                              local_68._M_head_impl =
                                   (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>
                                    *)protobuf::internal::ExtensionSet::GetRepeatedDouble
                                                (&(this->_impl_)._extensions_,
                                                 proto2_unittest::packed_double_extension_lite,1);
                              testing::internal::CmpHelperEQ<int,double>
                                        ((internal *)local_58,"712",
                                         "message.GetExtension(unittest::packed_double_extension_lite, 1)"
                                         ,(int *)&local_70,(double *)&local_68);
                              if (local_58[0] == (internal)0x0) {
                                testing::Message::Message((Message *)&local_68);
                                if (local_50 ==
                                    (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)0x0) {
                                  pcVar3 = anon_var_dwarf_a12c75 + 5;
                                }
                                else {
                                  pcVar3 = (local_50->_M_dataplus)._M_p;
                                }
                                testing::internal::AssertHelper::AssertHelper
                                          (&local_70,kNonFatalFailure,
                                           "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util_lite.cc"
                                           ,0x745,pcVar3);
                                testing::internal::AssertHelper::operator=
                                          (&local_70,(Message *)&local_68);
                                testing::internal::AssertHelper::~AssertHelper(&local_70);
                                if (local_68._M_head_impl !=
                                    (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)0x0) {
                                  (**(code **)(*(long *)local_68._M_head_impl + 8))();
                                }
                              }
                              if (local_50 !=
                                  (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)0x0) {
                                std::
                                default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                              *)&local_50,local_50);
                              }
                              bVar2 = protobuf::internal::ExtensionSet::GetRepeatedBool
                                                (&(this->_impl_)._extensions_,
                                                 proto2_unittest::packed_bool_extension_lite,1);
                              local_68._M_head_impl._0_1_ = !bVar2;
                              local_60 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                          *)0x0;
                              if (bVar2) {
                                testing::Message::Message((Message *)&local_70);
                                testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                                          ((string *)local_58,(internal *)&local_68,
                                           (AssertionResult *)
                                           "message.GetExtension(unittest::packed_bool_extension_lite, 1)"
                                           ,"true","false",in_R9);
                                testing::internal::AssertHelper::AssertHelper
                                          (&local_38,kNonFatalFailure,
                                           "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util_lite.cc"
                                           ,0x746,(char *)CONCAT71(local_58._1_7_,local_58[0]));
                                testing::internal::AssertHelper::operator=
                                          (&local_38,(Message *)&local_70);
                                testing::internal::AssertHelper::~AssertHelper(&local_38);
                                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                     *)CONCAT71(local_58._1_7_,local_58[0]) != &local_48) {
                                  operator_delete((
                                                  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                                  *)CONCAT71(local_58._1_7_,local_58[0]),
                                                  local_48._M_allocated_capacity + 1);
                                }
                                if ((long *)CONCAT44(local_70.data_._4_4_,local_70.data_._0_4_) !=
                                    (long *)0x0) {
                                  (**(code **)(*(long *)CONCAT44(local_70.data_._4_4_,
                                                                 local_70.data_._0_4_) + 8))();
                                }
                              }
                              if (local_60 !=
                                  (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)0x0) {
                                std::
                                default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                              *)&local_60,local_60);
                              }
                              local_68._M_head_impl._0_4_ = 6;
                              local_70.data_._0_4_ =
                                   (float)protobuf::internal::ExtensionSet::GetRepeatedEnum
                                                    (&(this->_impl_)._extensions_,
                                                     proto2_unittest::packed_enum_extension_lite,1);
                              testing::internal::
                              CmpHelperEQ<proto2_unittest::ForeignEnumLite,proto2_unittest::ForeignEnumLite>
                                        ((internal *)local_58,"unittest::FOREIGN_LITE_BAZ",
                                         "message.GetExtension(unittest::packed_enum_extension_lite, 1)"
                                         ,(ForeignEnumLite *)&local_68,(ForeignEnumLite *)&local_70)
                              ;
                              if (local_58[0] == (internal)0x0) {
                                testing::Message::Message((Message *)&local_68);
                                if (local_50 ==
                                    (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)0x0) {
                                  pcVar3 = anon_var_dwarf_a12c75 + 5;
                                }
                                else {
                                  pcVar3 = (local_50->_M_dataplus)._M_p;
                                }
                                testing::internal::AssertHelper::AssertHelper
                                          (&local_70,kNonFatalFailure,
                                           "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util_lite.cc"
                                           ,0x748,pcVar3);
                                testing::internal::AssertHelper::operator=
                                          (&local_70,(Message *)&local_68);
                                testing::internal::AssertHelper::~AssertHelper(&local_70);
                                if (local_68._M_head_impl !=
                                    (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)0x0) {
                                  (**(code **)(*(long *)local_68._M_head_impl + 8))();
                                }
                              }
                              if (local_50 !=
                                  (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)0x0) {
                                std::
                                default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                              *)&local_50,local_50);
                              }
                            }
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  return;
}

Assistant:

void TestUtilLite::ExpectPackedExtensionsSet(
    const unittest::TestPackedExtensionsLite& message) {
  ASSERT_EQ(2, message.ExtensionSize(unittest::packed_int32_extension_lite));
  ASSERT_EQ(2, message.ExtensionSize(unittest::packed_int64_extension_lite));
  ASSERT_EQ(2, message.ExtensionSize(unittest::packed_uint32_extension_lite));
  ASSERT_EQ(2, message.ExtensionSize(unittest::packed_uint64_extension_lite));
  ASSERT_EQ(2, message.ExtensionSize(unittest::packed_sint32_extension_lite));
  ASSERT_EQ(2, message.ExtensionSize(unittest::packed_sint64_extension_lite));
  ASSERT_EQ(2, message.ExtensionSize(unittest::packed_fixed32_extension_lite));
  ASSERT_EQ(2, message.ExtensionSize(unittest::packed_fixed64_extension_lite));
  ASSERT_EQ(2, message.ExtensionSize(unittest::packed_sfixed32_extension_lite));
  ASSERT_EQ(2, message.ExtensionSize(unittest::packed_sfixed64_extension_lite));
  ASSERT_EQ(2, message.ExtensionSize(unittest::packed_float_extension_lite));
  ASSERT_EQ(2, message.ExtensionSize(unittest::packed_double_extension_lite));
  ASSERT_EQ(2, message.ExtensionSize(unittest::packed_bool_extension_lite));
  ASSERT_EQ(2, message.ExtensionSize(unittest::packed_enum_extension_lite));

  EXPECT_EQ(601,
            message.GetExtension(unittest::packed_int32_extension_lite, 0));
  EXPECT_EQ(602,
            message.GetExtension(unittest::packed_int64_extension_lite, 0));
  EXPECT_EQ(603,
            message.GetExtension(unittest::packed_uint32_extension_lite, 0));
  EXPECT_EQ(604,
            message.GetExtension(unittest::packed_uint64_extension_lite, 0));
  EXPECT_EQ(605,
            message.GetExtension(unittest::packed_sint32_extension_lite, 0));
  EXPECT_EQ(606,
            message.GetExtension(unittest::packed_sint64_extension_lite, 0));
  EXPECT_EQ(607,
            message.GetExtension(unittest::packed_fixed32_extension_lite, 0));
  EXPECT_EQ(608,
            message.GetExtension(unittest::packed_fixed64_extension_lite, 0));
  EXPECT_EQ(609,
            message.GetExtension(unittest::packed_sfixed32_extension_lite, 0));
  EXPECT_EQ(610,
            message.GetExtension(unittest::packed_sfixed64_extension_lite, 0));
  EXPECT_EQ(611,
            message.GetExtension(unittest::packed_float_extension_lite, 0));
  EXPECT_EQ(612,
            message.GetExtension(unittest::packed_double_extension_lite, 0));
  EXPECT_EQ(true,
            message.GetExtension(unittest::packed_bool_extension_lite, 0));
  EXPECT_EQ(unittest::FOREIGN_LITE_BAR,
            message.GetExtension(unittest::packed_enum_extension_lite, 0));
  EXPECT_EQ(701,
            message.GetExtension(unittest::packed_int32_extension_lite, 1));
  EXPECT_EQ(702,
            message.GetExtension(unittest::packed_int64_extension_lite, 1));
  EXPECT_EQ(703,
            message.GetExtension(unittest::packed_uint32_extension_lite, 1));
  EXPECT_EQ(704,
            message.GetExtension(unittest::packed_uint64_extension_lite, 1));
  EXPECT_EQ(705,
            message.GetExtension(unittest::packed_sint32_extension_lite, 1));
  EXPECT_EQ(706,
            message.GetExtension(unittest::packed_sint64_extension_lite, 1));
  EXPECT_EQ(707,
            message.GetExtension(unittest::packed_fixed32_extension_lite, 1));
  EXPECT_EQ(708,
            message.GetExtension(unittest::packed_fixed64_extension_lite, 1));
  EXPECT_EQ(709,
            message.GetExtension(unittest::packed_sfixed32_extension_lite, 1));
  EXPECT_EQ(710,
            message.GetExtension(unittest::packed_sfixed64_extension_lite, 1));
  EXPECT_EQ(711,
            message.GetExtension(unittest::packed_float_extension_lite, 1));
  EXPECT_EQ(712,
            message.GetExtension(unittest::packed_double_extension_lite, 1));
  EXPECT_FALSE(message.GetExtension(unittest::packed_bool_extension_lite, 1));
  EXPECT_EQ(unittest::FOREIGN_LITE_BAZ,
            message.GetExtension(unittest::packed_enum_extension_lite, 1));
}